

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O0

AST * parse_finish_default_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST *pAVar2;
  AST_Labeled_Statement *ret;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  translation_data_local =
       (Translation_Data *)get_labeled_statement_tree((token *)0x0,(AST *)0x0,ST_DEFAULT);
  cVar1 = get_and_check(translation_data,KW_COLUMN);
  if (cVar1 == '\0') {
    push_translation_error(" \':\' expected in default statement",translation_data);
    translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
  }
  else {
    pAVar2 = parse_statement(translation_data,scope);
    translation_data_local->number_of_errors_when_last_checked = (size_t)pAVar2;
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_finish_default_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST_Labeled_Statement *ret;
	ret=get_labeled_statement_tree(NULL,NULL,ST_DEFAULT);
	if(get_and_check(translation_data,KW_COLUMN))
	{
		ret->statement=parse_statement(translation_data,scope);
		return (struct AST*)ret;
	}else
	{
		push_translation_error(" ':' expected in default statement",translation_data);
		return (struct AST*)get_error_tree((struct AST*)ret);
	}
}